

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O3

void __thiscall
Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__3>
          (Parser *this,ParseNodePtr patternNode,anon_class_16_2_85211fcd handler)

{
  ParseNode *this_00;
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  char cVar4;
  Parser *in_RAX;
  ulong uVar5;
  ParseNodeBin *pPVar6;
  undefined4 *puVar7;
  ParseNodeArrLit *pPVar8;
  ParseNodeUni *pPVar9;
  ParseNodePtr *ppPVar10;
  ParseNodePtr *ppPVar11;
  char *pcVar12;
  Parser *pPVar13;
  anon_class_16_2_85211fcd handler_00;
  anon_class_16_2_85211fcd handler_01;
  anon_class_16_2_85211fcd handler_02;
  Parser *local_38;
  
  handler_00.this = handler.this;
  cVar4 = *(char *)&(this->m_nodeAllocator).
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                    super_Allocator.outOfMemoryFunc;
  uVar5 = CONCAT71((int7)((ulong)in_RAX >> 8),cVar4);
  local_38 = in_RAX;
  if (cVar4 == '1') {
    pPVar6 = ParseNode::AsParseNodeBin((ParseNode *)this);
    this = (Parser *)pPVar6->pnode1;
    uVar5 = CONCAT71((int7)((ulong)pPVar6 >> 8),
                     *(OpCode *)
                      &(this->m_nodeAllocator).
                       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                       super_Allocator.outOfMemoryFunc);
  }
  pcVar12 = (char *)(uVar5 & 0xfffffffd);
  if ((char)pcVar12 != 'p') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    pcVar12 = "patternNode->IsPattern()";
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2e8,"(patternNode->IsPattern())","patternNode->IsPattern()");
    if (!bVar2) {
LAB_0081871c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
    uVar5 = (ulong)*(byte *)&(this->m_nodeAllocator).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             .super_Allocator.outOfMemoryFunc;
  }
  if ((char)uVar5 == 'r') {
    pPVar8 = ParseNode::AsParseNodeArrLit((ParseNode *)this);
    pPVar13 = (Parser *)(pPVar8->super_ParseNodeUni).pnode1;
    if (pPVar13 != (Parser *)0x0) {
      ppPVar11 = (ParseNodePtr *)&local_38;
      local_38 = pPVar13;
      do {
        if (*(OpCode *)
             &(pPVar13->m_nodeAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
              super_Allocator.outOfMemoryFunc != knopList) {
LAB_00818702:
          handler_02.funcInfo = (FuncInfo **)pcVar12;
          handler_02.this = handler_00.this;
          MapBindIdentifierFromElement<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__3>
                    (pPVar13,patternNode,handler_02);
          return;
        }
        pPVar6 = ParseNode::AsParseNodeBin((ParseNode *)pPVar13);
        handler_00.funcInfo = (FuncInfo **)pcVar12;
        MapBindIdentifierFromElement<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__3>
                  ((Parser *)pPVar6->pnode1,patternNode,handler_00);
        pPVar6 = ParseNode::AsParseNodeBin(*ppPVar11);
        pPVar13 = (Parser *)pPVar6->pnode2;
        ppPVar11 = &pPVar6->pnode2;
      } while (pPVar13 != (Parser *)0x0);
    }
  }
  else {
    pPVar9 = ParseNode::AsParseNodeUni((ParseNode *)this);
    pPVar13 = (Parser *)pPVar9->pnode1;
    local_38 = pPVar13;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    if (pPVar13 != (Parser *)0x0) {
      ppPVar11 = (ParseNodePtr *)&local_38;
      do {
        cVar4 = *(char *)&(pPVar13->m_nodeAllocator).
                          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                          super_Allocator.outOfMemoryFunc;
        if (cVar4 != 'P') {
          if ((cVar4 != '\x11') && (cVar4 != 'q')) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            pcVar12 = "item->nop == knopObjectPatternMember || item->nop == knopEllipsis";
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                               ,0x2f2,
                               "(item->nop == knopObjectPatternMember || item->nop == knopEllipsis)"
                               ,"item->nop == knopObjectPatternMember || item->nop == knopEllipsis")
            ;
            if (!bVar2) goto LAB_0081871c;
            *puVar7 = 0;
            cVar4 = *(char *)&(pPVar13->m_nodeAllocator).
                              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                              .super_Allocator.outOfMemoryFunc;
          }
          if (cVar4 == 'q') {
            pPVar6 = ParseNode::AsParseNodeBin((ParseNode *)pPVar13);
            ppPVar11 = &pPVar6->pnode2;
          }
          else {
            pPVar9 = ParseNode::AsParseNodeUni((ParseNode *)pPVar13);
            ppPVar11 = &pPVar9->pnode1;
          }
          pPVar13 = (Parser *)*ppPVar11;
          goto LAB_00818702;
        }
        pPVar6 = ParseNode::AsParseNodeBin((ParseNode *)pPVar13);
        this_00 = pPVar6->pnode1;
        OVar3 = this_00->nop;
        if ((OVar3 != knopEllipsis) && (OVar3 != knopObjectPatternMember)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          pcVar12 = "item->nop == knopObjectPatternMember || item->nop == knopEllipsis";
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                             ,0x2f2,
                             "(item->nop == knopObjectPatternMember || item->nop == knopEllipsis)",
                             "item->nop == knopObjectPatternMember || item->nop == knopEllipsis");
          if (!bVar2) goto LAB_0081871c;
          *puVar7 = 0;
          OVar3 = this_00->nop;
        }
        if (OVar3 == knopObjectPatternMember) {
          pPVar6 = ParseNode::AsParseNodeBin(this_00);
          ppPVar10 = &pPVar6->pnode2;
        }
        else {
          pPVar9 = ParseNode::AsParseNodeUni(this_00);
          ppPVar10 = &pPVar9->pnode1;
        }
        handler_01.funcInfo = (FuncInfo **)pcVar12;
        handler_01.this = handler_00.this;
        MapBindIdentifierFromElement<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__3>
                  ((Parser *)*ppPVar10,patternNode,handler_01);
        pPVar6 = ParseNode::AsParseNodeBin(*ppPVar11);
        pPVar13 = (Parser *)pPVar6->pnode2;
        ppPVar11 = &pPVar6->pnode2;
      } while (pPVar13 != (Parser *)0x0);
    }
  }
  return;
}

Assistant:

static void MapBindIdentifier(ParseNodePtr patternNode, THandler handler)
    {
        if (patternNode->nop == knopAsg)
        {
            patternNode = patternNode->AsParseNodeBin()->pnode1;
        }

        Assert(patternNode->IsPattern());
        if (patternNode->nop == knopArrayPattern)
        {
            ForEachItemInList(patternNode->AsParseNodeArrLit()->pnode1, [&](ParseNodePtr item) {
                MapBindIdentifierFromElement(item, handler);
            });
        }
        else
        {
            ForEachItemInList(patternNode->AsParseNodeUni()->pnode1, [&](ParseNodePtr item) {
                Assert(item->nop == knopObjectPatternMember || item->nop == knopEllipsis);
                if (item->nop == knopObjectPatternMember)
                {
                    MapBindIdentifierFromElement(item->AsParseNodeBin()->pnode2, handler);
                }
                else
                {
                    MapBindIdentifierFromElement(item->AsParseNodeUni()->pnode1, handler);
                }
            });
        }
    }